

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QList<QFont::Tag> * __thiscall
QMap<QFont::Tag,_float>::keys
          (QList<QFont::Tag> *__return_storage_ptr__,QMap<QFont::Tag,_float> *this)

{
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar1;
  QList<QFont::Tag> *result;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                 *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (Tag *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (Tag *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<QFont::Tag>::reserve
              (__return_storage_ptr__,(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    transform<std::_Rb_tree_const_iterator<std::pair<QFont::Tag_const,float>>,std::back_insert_iterator<QList<QFont::Tag>>,QMapData<std::map<QFont::Tag,float,std::less<QFont::Tag>,std::allocator<std::pair<QFont::Tag_const,float>>>>::keys()const::_lambda(auto:1_const&)_1_>
              (*(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10),
               &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const
    {
        if (!d)
            return {};
        return d->keys();
    }